

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall
Json::BuiltStyledStreamWriter::BuiltStyledStreamWriter
          (BuiltStyledStreamWriter *this,string *indentation,Enum cs,string *colonSymbol,
          string *nullSymbol,string *endingLineFeedSymbol,bool useSpecialFloats,uint precision)

{
  (this->super_StreamWriter).sout_ = (ostream *)0x0;
  (this->super_StreamWriter)._vptr_StreamWriter =
       (_func_int **)&PTR__BuiltStyledStreamWriter_00649040;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indentString_)._M_dataplus._M_p = (pointer)&(this->indentString_).field_2;
  (this->indentString_)._M_string_length = 0;
  (this->indentString_).field_2._M_local_buf[0] = '\0';
  this->rightMargin_ = 0x4a;
  std::__cxx11::string::string((string *)&this->indentation_,(string *)indentation);
  this->cs_ = cs;
  std::__cxx11::string::string((string *)&this->colonSymbol_,(string *)colonSymbol);
  std::__cxx11::string::string((string *)&this->nullSymbol_,(string *)nullSymbol);
  std::__cxx11::string::string
            ((string *)&this->endingLineFeedSymbol_,(string *)endingLineFeedSymbol);
  this->field_0xd8 = this->field_0xd8 & 0xf8 | useSpecialFloats << 2;
  this->precision_ = precision;
  return;
}

Assistant:

BuiltStyledStreamWriter::BuiltStyledStreamWriter(
      JSONCPP_STRING const& indentation,
      CommentStyle::Enum cs,
      JSONCPP_STRING const& colonSymbol,
      JSONCPP_STRING const& nullSymbol,
      JSONCPP_STRING const& endingLineFeedSymbol,
      bool useSpecialFloats,
      unsigned int precision)
  : rightMargin_(74)
  , indentation_(indentation)
  , cs_(cs)
  , colonSymbol_(colonSymbol)
  , nullSymbol_(nullSymbol)
  , endingLineFeedSymbol_(endingLineFeedSymbol)
  , addChildValues_(false)
  , indented_(false)
  , useSpecialFloats_(useSpecialFloats)
  , precision_(precision)
{
}